

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cc
# Opt level: O2

Token __thiscall flow::lang::Lexer::continueParseIPv6(Lexer *this,bool firstComplete)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Token TVar4;
  undefined7 in_register_00000031;
  allocator<char> local_49;
  string local_48;
  
  if ((int)CONCAT71(in_register_00000031,firstComplete) == 0) {
    this->ipv6HexDigits_ = (this->stringValue_)._M_string_length;
    bVar2 = ipv6HexPart(this);
LAB_0012ddd6:
    iVar3 = this->currentChar_;
    while ((iVar3 == 0x2e && (iVar3 = peekChar(this), iVar3 - 0x30U < 10))) {
      do {
        std::__cxx11::string::push_back((char)this + -0x58);
        nextChar(this,true);
        iVar3 = this->currentChar_;
      } while (iVar3 - 0x30U < 10);
    }
    if (bVar2 != false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_48,(this->stringValue_)._M_dataplus._M_p,&local_49);
      bVar2 = util::IPAddress::set(&this->ipValue_,&local_48,V6);
      std::__cxx11::string::~string((string *)&local_48);
      if (bVar2) {
        if (this->currentChar_ == 0x2f) {
          TVar4 = continueCidr(this,0x80);
          return TVar4;
        }
        this->token_ = IP;
        return IP;
      }
    }
  }
  else {
    bVar2 = true;
    do {
      if (this->currentChar_ != 0x3a) goto LAB_0012ddd6;
      iVar3 = peekChar(this);
      if (iVar3 == 0x3a) {
        if ((this->currentChar_ == 0x3a) && (iVar3 = peekChar(this), iVar3 == 0x3a)) {
          std::__cxx11::string::append((char *)&this->stringValue_);
          nextChar(this,true);
          nextChar(this,true);
          bVar1 = isHexChar(this);
          if (bVar1) {
            bVar2 = ipv6HexSeq(this);
          }
        }
        goto LAB_0012ddd6;
      }
      std::__cxx11::string::push_back((char)&this->stringValue_);
      nextChar(this,true);
      bVar1 = ipv6HexDigit4(this);
    } while (bVar1);
  }
  this->token_ = Unknown;
  return Unknown;
}

Assistant:

Token Lexer::continueParseIPv6(bool firstComplete) {
  bool rv = true;
  if (firstComplete) {
    while (currentChar() == ':' && peekChar() != ':') {
      stringValue_ += ':';
      nextChar();

      if (!ipv6HexDigit4()) {
        return token_ = Token::Unknown;
      }
    }

    if (currentChar() == ':' && peekChar() == ':') {
      stringValue_ += "::";
      nextChar();
      nextChar();
      rv = isHexChar() ? ipv6HexSeq() : true;
    }
  } else {
    ipv6HexDigits_ = stringValue_.size();
    rv = ipv6HexPart();
  }

  // parse embedded IPv4 remainer
  while (currentChar_ == '.' && std::isdigit(peekChar())) {
    stringValue_ += '.';
    nextChar();

    while (std::isdigit(currentChar_)) {
      stringValue_ += static_cast<char>(currentChar_);
      nextChar();
    }
  }

  if (!rv)
    // Invalid IPv6
    return token_ = Token::Unknown;

  if (!ipValue_.set(stringValue_.c_str(), util::IPAddress::Family::V6))
    // Invalid IPv6
    return token_ = Token::Unknown;

  if (currentChar_ != '/') return token_ = Token::IP;

  return continueCidr(128);
}